

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O0

Remotes * Omega_h::form_down_use_owners
                    (Remotes *__return_storage_ptr__,Mesh *mesh,Int high_dim,Int low_dim)

{
  Remotes local_c0;
  Read<int> local_a0;
  undefined1 local_90 [8];
  Remotes lows2owners;
  Adj local_60;
  undefined1 local_30 [8];
  LOs uses2lows;
  Int low_dim_local;
  Int high_dim_local;
  Mesh *mesh_local;
  
  uses2lows.write_.shared_alloc_.direct_ptr._0_4_ = low_dim;
  uses2lows.write_.shared_alloc_.direct_ptr._4_4_ = high_dim;
  Mesh::ask_down(&local_60,mesh,high_dim,low_dim);
  Read<int>::Read((Read<int> *)local_30,&local_60.super_Graph.ab2b);
  Adj::~Adj(&local_60);
  Mesh::ask_owners((Remotes *)local_90,mesh,(Int)uses2lows.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_a0,(Read<int> *)local_30);
  Remotes::Remotes(&local_c0,(Remotes *)local_90);
  unmap(__return_storage_ptr__,&local_a0,&local_c0);
  Remotes::~Remotes(&local_c0);
  Read<int>::~Read(&local_a0);
  Remotes::~Remotes((Remotes *)local_90);
  Read<int>::~Read((Read<int> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Remotes form_down_use_owners(Mesh* mesh, Int high_dim, Int low_dim) {
  auto uses2lows = mesh->ask_down(high_dim, low_dim).ab2b;
  auto lows2owners = mesh->ask_owners(low_dim);
  return unmap(uses2lows, lows2owners);
}